

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O1

void __thiscall
trun::TestResponseProxy::SetPostCaseCallback(TestResponseProxy *this,CBPrePostHook *cbPostCase)

{
  Ref testModule;
  undefined8 local_20;
  undefined8 local_18;
  
  TestRunner::GetCurrentTestModule();
  if (local_20 != 0) {
    *(CBPrePostHook *)(local_20 + 0x160) = *cbPostCase;
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

void TestResponseProxy::SetPostCaseCallback(const CBPrePostHook &cbPostCase) {
    auto testModule = TestRunner::GetCurrentTestModule();
    if (testModule != nullptr) {
        testModule->cbPostHook = cbPostCase;
    }
}